

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

ContentSpecNode *
xercesc_4_0::makeRepNode(XMLCh testCh,ContentSpecNode *prevNode,MemoryManager *manager)

{
  MemoryManager *manager_local;
  ContentSpecNode *prevNode_local;
  ContentSpecNode *pCStack_10;
  XMLCh testCh_local;
  
  if (testCh == L'?') {
    pCStack_10 = (ContentSpecNode *)XMemory::operator_new(0x40,manager);
    ContentSpecNode::ContentSpecNode
              (pCStack_10,ZeroOrOne,prevNode,(ContentSpecNode *)0x0,true,true,manager);
  }
  else if (testCh == L'+') {
    pCStack_10 = (ContentSpecNode *)XMemory::operator_new(0x40,manager);
    ContentSpecNode::ContentSpecNode
              (pCStack_10,OneOrMore,prevNode,(ContentSpecNode *)0x0,true,true,manager);
  }
  else {
    pCStack_10 = prevNode;
    if (testCh == L'*') {
      pCStack_10 = (ContentSpecNode *)XMemory::operator_new(0x40,manager);
      ContentSpecNode::ContentSpecNode
                (pCStack_10,ZeroOrMore,prevNode,(ContentSpecNode *)0x0,true,true,manager);
    }
  }
  return pCStack_10;
}

Assistant:

static ContentSpecNode* makeRepNode(const XMLCh testCh,
                                    ContentSpecNode* const prevNode,
                                    MemoryManager* const manager)
{
    if (testCh == chQuestion)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::ZeroOrOne
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }
     else if (testCh == chPlus)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::OneOrMore
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }
     else if (testCh == chAsterisk)
    {
        return new (manager) ContentSpecNode
        (
            ContentSpecNode::ZeroOrMore
            , prevNode
            , 0
            , true
            , true
            , manager
        );
    }

    // Just return the incoming node
    return prevNode;
}